

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O1

PRECandidates * __thiscall
GlobOpt::FindBackEdgePRECandidates(GlobOpt *this,BasicBlock *block,JitArenaAllocator *alloc)

{
  RealCount *pRVar1;
  ValueHashTable<Sym_*,_Value_*> *this_00;
  Sym *sym;
  Sym *pSVar2;
  long lVar3;
  SymIdToInstrMap *pSVar4;
  Type piVar5;
  code *pcVar6;
  bool bVar7;
  BOOLEAN BVar8;
  uint uVar9;
  PRECandidates *pPVar10;
  undefined4 *puVar11;
  Type *pTVar12;
  BasicBlock *pBVar13;
  Value **ppVVar14;
  Value *pVVar15;
  PRECandidatesList *pPVar16;
  BVSparse<Memory::JitArenaAllocator> *pBVar17;
  Type pSVar18;
  ulong uVar19;
  uint uVar20;
  undefined1 local_50 [8];
  Iterator __iter;
  
  __iter.current = (NodeBase *)block->loop;
  this_00 = (block->globOptData).symToValueMap;
  pPVar10 = (PRECandidates *)new<Memory::JitArenaAllocator>(0x18,this->tempAlloc,0x3f1274);
  pPVar10->candidatesToProcess = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  pPVar10->candidatesBv = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  pPVar10->candidatesList = (PRECandidatesList *)0x0;
  if (this_00->tableSize != 0) {
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    uVar19 = 0;
    do {
      local_50 = (undefined1  [8])(this_00->table + uVar19);
      __iter.list = (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
                    local_50;
LAB_00424cf6:
      if (__iter.list ==
          (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar11 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar7) {
          pcVar6 = (code *)invalidInstructionException();
          (*pcVar6)();
        }
        *puVar11 = 0;
      }
      __iter.list = (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
                    ((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
      if ((undefined1  [8])__iter.list != local_50) {
        pTVar12 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::Iterator
                  ::Data((Iterator *)local_50);
        sym = pTVar12->value;
        if (((sym->m_kind == SymKindProperty) &&
            (BVar8 = BVSparse<Memory::JitArenaAllocator>::Test
                               ((block->globOptData).liveFields,sym->m_id), BVar8 != '\0')) &&
           (BVar8 = BVSparse<Memory::JitArenaAllocator>::Test
                              ((BVSparse<Memory::JitArenaAllocator> *)
                               __iter.current[9].next[0x1c].next,sym->m_id), BVar8 != '\0')) {
          pVVar15 = pTVar12->element;
          pSVar2 = pVVar15->valueInfo->symStore;
          if ((pSVar2 != (Sym *)0x0) && (pSVar2->m_kind == SymKindStack)) {
            if ((((ulong)pSVar2[1]._vptr_Sym & 1) == 0) ||
               (lVar3._0_4_ = pSVar2[1].m_id, lVar3._4_1_ = pSVar2[1].m_kind,
               lVar3._5_3_ = *(undefined3 *)&pSVar2[1].field_0x15, lVar3 == 0)) {
LAB_00424df6:
              ppVVar14 = ValueHashTable<Sym_*,_Value_*>::Get(this_00,pSVar2->m_id);
              if ((ppVVar14 == (Value **)0x0) || ((*ppVVar14)->valueNumber != pVVar15->valueNumber))
              goto LAB_00424cf6;
            }
            else {
              pBVar13 = Loop::GetHeadBlock((Loop *)__iter.current);
              BVar8 = BVSparse<Memory::JitArenaAllocator>::Test
                                (pBVar13->upwardExposedUses,pSVar2->m_id);
              if (BVar8 != '\0') goto LAB_00424df6;
            }
            pVVar15 = GlobOptBlockData::FindValue
                                ((GlobOptBlockData *)(__iter.current[9].next + 0x1a),sym);
            if (pVVar15 != (Value *)0x0) {
              pSVar4 = this->prePassInstrMap;
              piVar5 = pSVar4->buckets;
              uVar9 = 0;
              if (piVar5 != (Type)0x0) {
                uVar9 = JsUtil::
                        BaseDictionary<unsigned_int,_IR::Instr_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                        ::GetBucket(sym->m_id * 2 + 1,pSVar4->bucketCount,pSVar4->modFunctionIndex);
                uVar20 = piVar5[uVar9];
                uVar9 = 0;
                if (-1 < (int)uVar20) {
                  uVar9 = 0;
                  do {
                    if (pSVar4->entries[uVar20].
                        super_DefaultHashedEntry<unsigned_int,_IR::Instr_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                        .super_KeyValueEntry<unsigned_int,_IR::Instr_*>.
                        super_ValueEntry<IR::Instr_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_IR::Instr_*>_>
                        .super_KeyValueEntryDataLayout2<unsigned_int,_IR::Instr_*>.key == sym->m_id)
                    {
                      if (pSVar4->stats != (DictionaryStats *)0x0) {
                        DictionaryStats::Lookup(pSVar4->stats,uVar9);
                      }
                      goto LAB_00424ec3;
                    }
                    uVar9 = uVar9 + 1;
                    uVar20 = pSVar4->entries[uVar20].
                             super_DefaultHashedEntry<unsigned_int,_IR::Instr_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                             .super_KeyValueEntry<unsigned_int,_IR::Instr_*>.
                             super_ValueEntry<IR::Instr_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_IR::Instr_*>_>
                             .super_KeyValueEntryDataLayout2<unsigned_int,_IR::Instr_*>.next;
                  } while (-1 < (int)uVar20);
                }
              }
              uVar20 = 0xffffffff;
              if (pSVar4->stats != (DictionaryStats *)0x0) {
                DictionaryStats::Lookup(pSVar4->stats,uVar9);
              }
LAB_00424ec3:
              if ((-1 < (int)uVar20) &&
                 (pSVar4->entries[uVar20].
                  super_DefaultHashedEntry<unsigned_int,_IR::Instr_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                  .super_KeyValueEntry<unsigned_int,_IR::Instr_*>.
                  super_ValueEntry<IR::Instr_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_IR::Instr_*>_>
                  .super_KeyValueEntryDataLayout2<unsigned_int,_IR::Instr_*>.value != (Instr *)0x0))
              {
                if (pPVar10->candidatesList == (PRECandidatesList *)0x0) {
                  pPVar16 = (PRECandidatesList *)new<Memory::JitArenaAllocator>(0x18,alloc,0x3f1274)
                  ;
                  (pPVar16->
                  super_SListBase<HashBucket<Sym_*,_Value_*>_*,_Memory::JitArenaAllocator,_RealCount>
                  ).super_RealCount.count = 0;
                  (pPVar16->
                  super_SListBase<HashBucket<Sym_*,_Value_*>_*,_Memory::JitArenaAllocator,_RealCount>
                  ).super_SListNodeBase<Memory::JitArenaAllocator>.next = (Type)pPVar16;
                  pPVar16->allocator = alloc;
                  pPVar10->candidatesList = pPVar16;
                  pBVar17 = (BVSparse<Memory::JitArenaAllocator> *)
                            new<Memory::JitArenaAllocator>(0x20,alloc,0x3f1274);
                  pBVar17->head = (Type_conflict)0x0;
                  pBVar17->lastFoundIndex = (Type_conflict)0x0;
                  pBVar17->alloc = alloc;
                  pBVar17->lastUsedNodePrevNextField = (Type)pBVar17;
                  pPVar10->candidatesToProcess = pBVar17;
                  pBVar17 = (BVSparse<Memory::JitArenaAllocator> *)
                            new<Memory::JitArenaAllocator>(0x20,alloc,0x3f1274);
                  pBVar17->head = (Type_conflict)0x0;
                  pBVar17->lastFoundIndex = (Type_conflict)0x0;
                  pBVar17->alloc = alloc;
                  pBVar17->lastUsedNodePrevNextField = (Type)pBVar17;
                  pPVar10->candidatesBv = pBVar17;
                }
                pPVar16 = pPVar10->candidatesList;
                pSVar18 = (Type)new<Memory::JitArenaAllocator>(0x10,pPVar16->allocator,0x3f1274);
                pSVar18[1].next = (Type)pTVar12;
                pSVar18->next =
                     (pPVar16->
                     super_SListBase<HashBucket<Sym_*,_Value_*>_*,_Memory::JitArenaAllocator,_RealCount>
                     ).super_SListNodeBase<Memory::JitArenaAllocator>.next;
                (pPVar16->
                super_SListBase<HashBucket<Sym_*,_Value_*>_*,_Memory::JitArenaAllocator,_RealCount>)
                .super_SListNodeBase<Memory::JitArenaAllocator>.next = pSVar18;
                pRVar1 = &(pPVar16->
                          super_SListBase<HashBucket<Sym_*,_Value_*>_*,_Memory::JitArenaAllocator,_RealCount>
                          ).super_RealCount;
                pRVar1->count = pRVar1->count + 1;
                BVSparse<Memory::JitArenaAllocator>::Set(pPVar10->candidatesToProcess,sym->m_id);
                BVSparse<Memory::JitArenaAllocator>::Set(pPVar10->candidatesBv,sym->m_id);
              }
            }
          }
        }
        goto LAB_00424cf6;
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 < this_00->tableSize);
  }
  return pPVar10;
}

Assistant:

PRECandidates * GlobOpt::FindBackEdgePRECandidates(BasicBlock *block, JitArenaAllocator *alloc)
{
    // Iterate over the value table looking for propertySyms which are candidates to
    // pre-load in the landing pad for field PRE

    GlobHashTable *valueTable = block->globOptData.symToValueMap;
    Loop *loop = block->loop;
    PRECandidates *candidates = JitAnew(this->tempAlloc, PRECandidates);

    for (uint i = 0; i < valueTable->tableSize; i++)
    {
        FOREACH_SLISTBASE_ENTRY(GlobHashBucket, bucket, &valueTable->table[i])
        {
            Sym *sym = bucket.value;

            if (!sym->IsPropertySym())
            {
                continue;
            }

            PropertySym *propertySym = sym->AsPropertySym();

            // Field should be live on the back-edge
            if (!block->globOptData.liveFields->Test(propertySym->m_id))
            {
                continue;
            }

            // Field should be live in the landing pad as well
            if (!loop->landingPad->globOptData.liveFields->Test(propertySym->m_id))
            {
                continue;
            }

            Value *value = bucket.element;
            Sym *symStore = value->GetValueInfo()->GetSymStore();

            if (!symStore || !symStore->IsStackSym())
            {
                continue;
            }

            // Check upwardExposed in case of:
            //  s1 = 0;
            // loop:
            //        = o.x;
            //        foo();
            //    o.x = s1;
            // Can't thrash s1 in loop top.
            if (!symStore->AsStackSym()->IsSingleDef() || loop->GetHeadBlock()->upwardExposedUses->Test(symStore->m_id))
            {
                // If symStore isn't singleDef, we need to make sure it still has the same value.
                // This usually fails if we are not aggressive at transferring values in the prepass.
                Value **pSymStoreFromValue = valueTable->Get(symStore->m_id);

                // Consider: We should be fine if symStore isn't live in landing pad...
                if (!pSymStoreFromValue || (*pSymStoreFromValue)->GetValueNumber() != value->GetValueNumber())
                {
                    continue;
                }
            }

            BasicBlock *landingPad = loop->landingPad;
            Value *landingPadValue = landingPad->globOptData.FindValue(propertySym);

            if (!landingPadValue)
            {
                // Value should be added as initial value or already be there.
                continue;
            }

            IR::Instr * ldInstr = this->prePassInstrMap->Lookup(propertySym->m_id, nullptr);

            if (!ldInstr)
            {
                continue;
            }

            if (!candidates->candidatesList)
            {
                candidates->candidatesList = JitAnew(alloc, PRECandidatesList, alloc);
                candidates->candidatesToProcess = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
                candidates->candidatesBv = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
            }

            candidates->candidatesList->Prepend(&bucket);
            candidates->candidatesToProcess->Set(propertySym->m_id);
            candidates->candidatesBv->Set(propertySym->m_id);

        } NEXT_SLISTBASE_ENTRY;
    }

    return candidates;
}